

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyRigidBodyCollisionConfiguration.cpp
# Opt level: O1

void __thiscall
btSoftBodyRigidBodyCollisionConfiguration::btSoftBodyRigidBodyCollisionConfiguration
          (btSoftBodyRigidBodyCollisionConfiguration *this,
          btDefaultCollisionConstructionInfo *constructionInfo)

{
  btCollisionAlgorithmCreateFunc *pbVar1;
  btPoolAllocator *pbVar2;
  
  btDefaultCollisionConfiguration::btDefaultCollisionConfiguration
            (&this->super_btDefaultCollisionConfiguration,constructionInfo);
  (this->super_btDefaultCollisionConfiguration).super_btCollisionConfiguration.
  _vptr_btCollisionConfiguration =
       (_func_int **)&PTR__btSoftBodyRigidBodyCollisionConfiguration_002298c0;
  pbVar1 = (btCollisionAlgorithmCreateFunc *)btAlignedAllocInternal(0x10,0x10);
  pbVar1->m_swapped = false;
  pbVar1->_vptr_btCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__btCollisionAlgorithmCreateFunc_00229918;
  this->m_softSoftCreateFunc = pbVar1;
  pbVar1 = (btCollisionAlgorithmCreateFunc *)btAlignedAllocInternal(0x10,0x10);
  pbVar1->m_swapped = false;
  pbVar1->_vptr_btCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__btCollisionAlgorithmCreateFunc_00229958;
  this->m_softRigidConvexCreateFunc = pbVar1;
  pbVar1 = (btCollisionAlgorithmCreateFunc *)btAlignedAllocInternal(0x10,0x10);
  pbVar1->m_swapped = false;
  pbVar1->_vptr_btCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__btCollisionAlgorithmCreateFunc_00229958;
  this->m_swappedSoftRigidConvexCreateFunc = pbVar1;
  pbVar1->m_swapped = true;
  pbVar1 = (btCollisionAlgorithmCreateFunc *)btAlignedAllocInternal(0x10,0x10);
  pbVar1->m_swapped = false;
  pbVar1->_vptr_btCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__btCollisionAlgorithmCreateFunc_00229998;
  this->m_softRigidConcaveCreateFunc = pbVar1;
  pbVar1 = (btCollisionAlgorithmCreateFunc *)btAlignedAllocInternal(0x10,0x10);
  pbVar1->m_swapped = false;
  pbVar1->_vptr_btCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__btCollisionAlgorithmCreateFunc_002299d8;
  this->m_swappedSoftRigidConcaveCreateFunc = pbVar1;
  pbVar1->m_swapped = true;
  if ((((this->super_btDefaultCollisionConfiguration).m_ownsCollisionAlgorithmPool == true) &&
      (pbVar2 = (this->super_btDefaultCollisionConfiguration).m_collisionAlgorithmPool,
      pbVar2 != (btPoolAllocator *)0x0)) && (pbVar2->m_elemSize < 0xf8)) {
    btAlignedFreeInternal(pbVar2->m_pool);
    btAlignedFreeInternal((this->super_btDefaultCollisionConfiguration).m_collisionAlgorithmPool);
    pbVar2 = (btPoolAllocator *)btAlignedAllocInternal(0x20,0x10);
    btPoolAllocator::btPoolAllocator
              (pbVar2,0xf8,constructionInfo->m_defaultMaxCollisionAlgorithmPoolSize);
    (this->super_btDefaultCollisionConfiguration).m_collisionAlgorithmPool = pbVar2;
  }
  return;
}

Assistant:

btSoftBodyRigidBodyCollisionConfiguration::btSoftBodyRigidBodyCollisionConfiguration(const btDefaultCollisionConstructionInfo& constructionInfo)
:btDefaultCollisionConfiguration(constructionInfo)
{
	void* mem;

	mem = btAlignedAlloc(sizeof(btSoftSoftCollisionAlgorithm::CreateFunc),16);
	m_softSoftCreateFunc = new(mem) btSoftSoftCollisionAlgorithm::CreateFunc;

	mem = btAlignedAlloc(sizeof(btSoftRigidCollisionAlgorithm::CreateFunc),16);
	m_softRigidConvexCreateFunc = new(mem) btSoftRigidCollisionAlgorithm::CreateFunc;

	mem = btAlignedAlloc(sizeof(btSoftRigidCollisionAlgorithm::CreateFunc),16);
	m_swappedSoftRigidConvexCreateFunc = new(mem) btSoftRigidCollisionAlgorithm::CreateFunc;
	m_swappedSoftRigidConvexCreateFunc->m_swapped=true;

#ifdef ENABLE_SOFTBODY_CONCAVE_COLLISIONS
	mem = btAlignedAlloc(sizeof(btSoftBodyConcaveCollisionAlgorithm::CreateFunc),16);
	m_softRigidConcaveCreateFunc = new(mem) btSoftBodyConcaveCollisionAlgorithm::CreateFunc;

	mem = btAlignedAlloc(sizeof(btSoftBodyConcaveCollisionAlgorithm::CreateFunc),16);
	m_swappedSoftRigidConcaveCreateFunc = new(mem) btSoftBodyConcaveCollisionAlgorithm::SwappedCreateFunc;
	m_swappedSoftRigidConcaveCreateFunc->m_swapped=true;
#endif

	//replace pool by a new one, with potential larger size

	if (m_ownsCollisionAlgorithmPool && m_collisionAlgorithmPool)
	{
		int curElemSize = m_collisionAlgorithmPool->getElementSize();
		///calculate maximum element size, big enough to fit any collision algorithm in the memory pool


		int maxSize0 = sizeof(btSoftSoftCollisionAlgorithm);
		int maxSize1 = sizeof(btSoftRigidCollisionAlgorithm);
		int maxSize2 = sizeof(btSoftBodyConcaveCollisionAlgorithm);

		int	collisionAlgorithmMaxElementSize = btMax(maxSize0,maxSize1);
		collisionAlgorithmMaxElementSize = btMax(collisionAlgorithmMaxElementSize,maxSize2);
		
		if (collisionAlgorithmMaxElementSize > curElemSize)
		{
			m_collisionAlgorithmPool->~btPoolAllocator();
			btAlignedFree(m_collisionAlgorithmPool);
			void* mem = btAlignedAlloc(sizeof(btPoolAllocator),16);
			m_collisionAlgorithmPool = new(mem) btPoolAllocator(collisionAlgorithmMaxElementSize,constructionInfo.m_defaultMaxCollisionAlgorithmPoolSize);
		}
	}

}